

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O2

void FT_Vector_Polarize(FT_Vector *vec,FT_Fixed *length,FT_Angle *angle)

{
  FT_Int FVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  FT_Vector v;
  FT_Vector local_38;
  
  if (angle != (FT_Angle *)0x0 && (length != (FT_Fixed *)0x0 && vec != (FT_Vector *)0x0)) {
    local_38.x = vec->x;
    local_38.y = vec->y;
    if (local_38.y != 0 || local_38.x != 0) {
      FVar1 = ft_trig_prenorm(&local_38);
      ft_trig_pseudo_polarize(&local_38);
      lVar2 = -local_38.x;
      if (0 < local_38.x) {
        lVar2 = local_38.x;
      }
      uVar3 = lVar2 * 0xdbd95b16 + 0x40000000U >> 0x20;
      uVar4 = -uVar3;
      if (-1 < local_38.x) {
        uVar4 = uVar3;
      }
      uVar3 = (ulong)(uint)((int)uVar4 << (-(byte)FVar1 & 0x1f));
      if (-1 < FVar1) {
        uVar3 = (long)uVar4 >> ((byte)FVar1 & 0x3f);
      }
      *length = uVar3;
      *angle = local_38.y;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Polarize( FT_Vector*  vec,
                      FT_Fixed   *length,
                      FT_Angle   *angle )
  {
    FT_Int     shift;
    FT_Vector  v;


    if ( !vec || !length || !angle )
      return;

    v = *vec;

    if ( v.x == 0 && v.y == 0 )
      return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_polarize( &v );

    v.x = ft_trig_downscale( v.x );

    *length = shift >= 0 ?                      ( v.x >>  shift )
                         : (FT_Fixed)( (FT_UInt32)v.x << -shift );
    *angle  = v.y;
  }